

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.hpp
# Opt level: O2

void __thiscall
afsm::
priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
::enqueue_event<afsm::test::events::begin>
          (priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
           *this,begin *event,event_priority_type priority)

{
  event_priority_type local_34;
  anon_class_16_3_3ecbcd59 local_30;
  
  local_34 = priority;
  std::mutex::lock(&this->mutex_);
  LOCK();
  (this->queue_size_).super___atomic_base<unsigned_long>._M_i =
       (this->queue_size_).super___atomic_base<unsigned_long>._M_i + 1;
  UNLOCK();
  detail::observer_wrapper<afsm::test::test_fsm_observer>::
  enqueue_event<afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::events::begin>
            (&this->super_observer_wrapper<afsm::test::test_fsm_observer>,this,event);
  local_30.priority = local_34;
  local_30.this = this;
  std::
  priority_queue<std::pair<std::function<afsm::actions::event_process_result()>,int>,std::vector<std::pair<std::function<afsm::actions::event_process_result()>,int>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,int>>>,afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>::event_comparison>
  ::
  emplace<afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>::enqueue_event<afsm::test::events::begin>(afsm::test::events::begin&&,int)::_lambda()_1_,int&>
            ((priority_queue<std::pair<std::function<afsm::actions::event_process_result()>,int>,std::vector<std::pair<std::function<afsm::actions::event_process_result()>,int>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,int>>>,afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>::event_comparison>
              *)&this->queued_events_,&local_30,&local_34);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  process_event_queue(this);
  return;
}

Assistant:

void
    enqueue_event(Event&& event, event_priority_type priority)
    {
        {
            lock_guard lock{mutex_};
            ++queue_size_;
            observer_wrapper::enqueue_event(*this, ::std::forward<Event>(event));
            Event evt{::std::forward<Event>(event)};
            queued_events_.emplace([&, evt, priority]() mutable {
                return process_event_dispatch(::std::move(evt), priority);
            }, priority);
        }
        // Process enqueued events in case we've been waiting for queue
        // mutex release
        process_event_queue();
    }